

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O0

bool __thiscall node_result_compare::operator()(node_result_compare *this,node *lhs,node *rhs)

{
  bool local_29;
  node *rhs_local;
  node *lhs_local;
  node_result_compare *this_local;
  
  if (lhs->remaining_constraints == 0) {
    if (rhs->remaining_constraints == 0) {
      if ((lhs->problem).type == maximize) {
        local_29 = rhs->solution < lhs->solution;
      }
      else {
        local_29 = lhs->solution < rhs->solution;
      }
      this_local._7_1_ = local_29;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else if (rhs->remaining_constraints == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = lhs->remaining_constraints < rhs->remaining_constraints;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const node& lhs, const node& rhs) const
    {
        if (lhs.remaining_constraints == 0) {
            if (rhs.remaining_constraints == 0) {
                return lhs.problem.type ==
                           baryonyx::objective_function_type::maximize
                         ? lhs.solution > rhs.solution
                         : lhs.solution < rhs.solution;
            }

            return true;
        } else {
            if (rhs.remaining_constraints == 0) {
                return false;
            } else {
                return lhs.remaining_constraints < rhs.remaining_constraints;
            }
        }
    }